

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O1

void NULLCCanvas::CanvasDrawRectA(int x1,int y1,int x2,int y2,double alpha,Canvas *ptr)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
    return;
  }
  if (x1 < 1) {
    x1 = 0;
  }
  iVar2 = ptr->width;
  if (iVar2 < x2) {
    x2 = iVar2;
  }
  if (x1 < x2) {
    uVar4 = 0;
    if (0 < y1) {
      uVar4 = (ulong)(uint)y1;
    }
    uVar5 = (ulong)(uint)y2;
    if (ptr->height < y2) {
      uVar5 = (ulong)(uint)ptr->height;
    }
    dVar10 = 1.0 - alpha;
    iVar7 = (iVar2 * (int)uVar4 + x1) * 4;
    do {
      if ((int)uVar4 < (int)uVar5) {
        pcVar3 = (ptr->data).ptr;
        lVar6 = uVar5 - uVar4;
        iVar8 = iVar7;
        do {
          lVar9 = (long)iVar8;
          *(float *)(pcVar3 + lVar9 * 4) =
               (float)((double)ptr->color[0] * alpha +
                      (double)*(float *)(pcVar3 + lVar9 * 4) * dVar10);
          *(float *)(pcVar3 + lVar9 * 4 + 4) =
               (float)((double)ptr->color[1] * alpha +
                      (double)*(float *)(pcVar3 + lVar9 * 4 + 4) * dVar10);
          *(float *)(pcVar3 + lVar9 * 4 + 8) =
               (float)((double)ptr->color[2] * alpha +
                      (double)*(float *)(pcVar3 + lVar9 * 4 + 8) * dVar10);
          pcVar1 = pcVar3 + lVar9 * 4 + 0xc;
          pcVar1[0] = '\0';
          pcVar1[1] = '\0';
          pcVar1[2] = -0x80;
          pcVar1[3] = '?';
          iVar8 = iVar8 + iVar2 * 4;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
      x1 = x1 + 1;
      iVar7 = iVar7 + 4;
    } while (x1 != x2);
  }
  return;
}

Assistant:

void CanvasDrawRectA(int x1, int y1, int x2, int y2, double alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		for(int x = x1 < 0 ? 0 : x1, xe = x2 > ptr->width ? ptr->width : x2; x < xe; x++)
		{
			for(int y = y1 < 0 ? 0 : y1, ye = y2 > ptr->height ? ptr->height : y2; y < ye; y++)
			{
				float *pixel = &((float*)ptr->data.ptr)[y * ptr->width * 4 + x * 4];

				pixel[0] = float(ptr->color[0] * alpha + pixel[0] * (1.0 - alpha));
				pixel[1] = float(ptr->color[1] * alpha + pixel[1] * (1.0 - alpha));
				pixel[2] = float(ptr->color[2] * alpha + pixel[2] * (1.0 - alpha));
				pixel[3] = 1.0f;
			}
		}
	}